

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O2

void __thiscall
ON_ClassArray<ON_3dmConstructionPlane>::Empty(ON_ClassArray<ON_3dmConstructionPlane> *this)

{
  ulong uVar1;
  long lVar2;
  
  uVar1 = (ulong)(uint)this->m_count;
  lVar2 = uVar1 * 0xa8;
  while( true ) {
    if ((int)uVar1 < 1) break;
    ON_3dmConstructionPlane::~ON_3dmConstructionPlane
              ((ON_3dmConstructionPlane *)((long)&this->m_a[-1].m_plane.origin.x + lVar2));
    memset((void *)((long)&this->m_a[-1].m_plane.origin.x + lVar2),0,0xa8);
    ON_3dmConstructionPlane::ON_3dmConstructionPlane
              ((ON_3dmConstructionPlane *)((long)&this->m_a[-1].m_plane.origin.x + lVar2));
    uVar1 = (ulong)((int)uVar1 - 1);
    lVar2 = lVar2 + -0xa8;
  }
  this->m_count = 0;
  return;
}

Assistant:

void ON_ClassArray<T>::Empty()
{
  int i;
  for ( i = m_count-1; i >= 0; i-- ) {
    DestroyElement( m_a[i] );
    // This call to memset is ok even when T has a vtable
    // because in-place construction is used later.
    memset( (void*)(&m_a[i]), 0, sizeof(T) );
    ConstructDefaultElement( &m_a[i] );
  }
  m_count = 0;
}